

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

void icu_63::cloneUnicodeString(UElement *dst,UElement *src)

{
  UnicodeString *this;
  
  this = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)src);
  if (this != (UnicodeString *)0x0) {
    UnicodeString::UnicodeString(this,(UnicodeString *)src->pointer);
  }
  dst->pointer = this;
  return;
}

Assistant:

static void U_CALLCONV cloneUnicodeString(UElement *dst, UElement *src) {
    dst->pointer = new UnicodeString(*(UnicodeString*)src->pointer);
}